

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm-parse.cc
# Opt level: O3

void __thiscall
ParserBuilder::ParserBuilder
          (ParserBuilder *this,ParameterCollection *model,
          unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
          *pretrained)

{
  LookupParameter *this_00;
  uint uVar1;
  uint v;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  uint uVar6;
  value_type it;
  uint local_d8 [2];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  uint local_b0 [2];
  undefined1 local_a8 [20];
  ulong local_94;
  Parameter *local_88;
  unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *local_80;
  LSTMBuilder *local_78;
  LSTMBuilder *local_70;
  LSTMBuilder *local_68;
  LSTMBuilder *local_60;
  LSTMBuilder *local_58;
  LSTMBuilder *local_50;
  LSTMBuilder *local_48;
  Parameter *local_40;
  LookupParameter *local_38;
  
  local_80 = pretrained;
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (&this->stack_lstm,LAYERS,LSTM_INPUT_DIM,HIDDEN_DIM,model,false);
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (&this->output_lstm,LAYERS,LSTM_INPUT_DIM,HIDDEN_DIM,model,false);
  local_48 = &this->output_lstm;
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (&this->buffer_lstm,LAYERS,LSTM_INPUT_DIM,HIDDEN_DIM,model,false);
  local_50 = &this->buffer_lstm;
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (&this->action_lstm,LAYERS,ACTION_DIM,HIDDEN_DIM,model,false);
  local_58 = &this->action_lstm;
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (&this->ent_lstm_fwd,LAYERS,LSTM_INPUT_DIM,LSTM_INPUT_DIM,model,false);
  local_68 = &this->ent_lstm_rev;
  local_60 = &this->ent_lstm_fwd;
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (local_68,LAYERS,LSTM_INPUT_DIM,LSTM_INPUT_DIM,model,false);
  uVar1 = VOCAB_SIZE;
  local_94 = 0x100000001;
  local_b0[0] = INPUT_DIM;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar6 = (uint)model;
  uVar2 = dynet::ParameterCollection::add_lookup_parameters
                    (uVar6,(Dim *)(ulong)uVar1,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_w = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  this_00 = &this->p_t;
  dynet::LookupParameter::LookupParameter(this_00);
  uVar1 = ACTION_SIZE;
  local_94 = 0x100000001;
  local_b0[0] = ACTION_DIM;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_lookup_parameters
                    (uVar6,(Dim *)(ulong)uVar1,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_a = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  uVar1 = ACTION_SIZE;
  local_94 = 0x100000001;
  local_b0[0] = REL_DIM;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_lookup_parameters
                    (uVar6,(Dim *)(ulong)uVar1,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_r = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_38 = &this->p_p;
  dynet::LookupParameter::LookupParameter(local_38);
  local_94 = 0x100000001;
  local_b0[0] = HIDDEN_DIM;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_pbias = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_d8[0] = HIDDEN_DIM;
  local_d8[1] = HIDDEN_DIM;
  local_94 = 0x100000000;
  lVar3 = 0;
  do {
    uVar4 = local_94 & 0xffffffff;
    local_94 = CONCAT44(local_94._4_4_,(int)local_94 + 1);
    local_b0[uVar4] = *(uint *)((long)local_d8 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_A = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_d8[0] = HIDDEN_DIM;
  local_d8[1] = HIDDEN_DIM;
  local_94 = 0x100000000;
  lVar3 = 0;
  do {
    uVar4 = local_94 & 0xffffffff;
    local_94 = CONCAT44(local_94._4_4_,(int)local_94 + 1);
    local_b0[uVar4] = *(uint *)((long)local_d8 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_B = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_d8[0] = HIDDEN_DIM;
  local_d8[1] = HIDDEN_DIM;
  local_94 = 0x100000000;
  lVar3 = 0;
  do {
    uVar4 = local_94 & 0xffffffff;
    local_94 = CONCAT44(local_94._4_4_,(int)local_94 + 1);
    local_b0[uVar4] = *(uint *)((long)local_d8 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_O = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_d8[0] = HIDDEN_DIM;
  local_d8[1] = HIDDEN_DIM;
  local_94 = 0x100000000;
  lVar3 = 0;
  do {
    uVar4 = local_94 & 0xffffffff;
    local_94 = CONCAT44(local_94._4_4_,(int)local_94 + 1);
    local_b0[uVar4] = *(uint *)((long)local_d8 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_S = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_d8[0] = LSTM_INPUT_DIM;
  local_d8[1] = LSTM_INPUT_DIM;
  local_94 = 0x100000000;
  lVar3 = 0;
  do {
    uVar4 = local_94 & 0xffffffff;
    local_94 = CONCAT44(local_94._4_4_,(int)local_94 + 1);
    local_b0[uVar4] = *(uint *)((long)local_d8 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_H = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_d8[0] = LSTM_INPUT_DIM;
  local_d8[1] = LSTM_INPUT_DIM;
  local_94 = 0x100000000;
  lVar3 = 0;
  do {
    uVar4 = local_94 & 0xffffffff;
    local_94 = CONCAT44(local_94._4_4_,(int)local_94 + 1);
    local_b0[uVar4] = *(uint *)((long)local_d8 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_D = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_d8[0] = LSTM_INPUT_DIM;
  local_d8[1] = REL_DIM;
  local_94 = 0x100000000;
  lVar3 = 0;
  do {
    uVar4 = local_94 & 0xffffffff;
    local_94 = CONCAT44(local_94._4_4_,(int)local_94 + 1);
    local_b0[uVar4] = *(uint *)((long)local_d8 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_R = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_d8[0] = LSTM_INPUT_DIM;
  local_d8[1] = INPUT_DIM;
  local_94 = 0x100000000;
  lVar3 = 0;
  do {
    uVar4 = local_94 & 0xffffffff;
    local_94 = CONCAT44(local_94._4_4_,(int)local_94 + 1);
    local_b0[uVar4] = *(uint *)((long)local_d8 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_w2l = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_40 = &this->p_p2l;
  dynet::Parameter::Parameter(local_40);
  local_88 = &this->p_t2l;
  dynet::Parameter::Parameter(local_88);
  local_94 = 0x100000001;
  local_b0[0] = LSTM_INPUT_DIM;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_ib = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_94 = 0x100000001;
  local_b0[0] = LSTM_INPUT_DIM;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_cbias = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_d8[0] = ACTION_SIZE;
  local_d8[1] = HIDDEN_DIM;
  local_94 = 0x100000000;
  lVar3 = 0;
  do {
    uVar4 = local_94 & 0xffffffff;
    local_94 = CONCAT44(local_94._4_4_,(int)local_94 + 1);
    local_b0[uVar4] = *(uint *)((long)local_d8 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_p2a = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_94 = 0x100000001;
  local_b0[0] = ACTION_DIM;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_action_start = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_94 = 0x100000001;
  local_b0[0] = ACTION_SIZE;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_abias = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_94 = 0x100000001;
  local_b0[0] = LSTM_INPUT_DIM;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_buffer_guard = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_94 = 0x100000001;
  local_b0[0] = LSTM_INPUT_DIM;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_stack_guard = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_94 = 0x100000001;
  local_b0[0] = LSTM_INPUT_DIM;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_output_guard = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_94 = 0x100000001;
  local_b0[0] = LSTM_INPUT_DIM;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_start_of_word = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_94 = 0x100000001;
  local_b0[0] = LSTM_INPUT_DIM;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_end_of_word = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  uVar1 = CHAR_SIZE;
  local_94 = 0x100000001;
  local_b0[0] = INPUT_DIM;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_lookup_parameters
                    (uVar6,(Dim *)(ulong)uVar1,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->char_emb = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_70 = &this->fw_char_lstm;
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (local_70,LAYERS,LSTM_INPUT_DIM,LSTM_CHAR_OUTPUT_DIM >> 1,model,false);
  local_78 = &this->bw_char_lstm;
  dynet::VanillaLSTMBuilder::VanillaLSTMBuilder
            (local_78,LAYERS,LSTM_INPUT_DIM,LSTM_CHAR_OUTPUT_DIM >> 1,model,false);
  local_d8[0] = LSTM_INPUT_DIM;
  local_d8[1] = LSTM_INPUT_DIM * 2;
  local_94 = 0x100000000;
  lVar3 = 0;
  do {
    uVar4 = local_94 & 0xffffffff;
    local_94 = CONCAT44(local_94._4_4_,(int)local_94 + 1);
    local_b0[uVar4] = *(uint *)((long)local_d8 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  uVar2 = dynet::ParameterCollection::add_parameters
                    ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
  *(undefined8 *)&this->p_cW = uVar2;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  uVar1 = POS_SIZE;
  if (USE_POS == true) {
    local_94 = 0x100000001;
    local_b0[0] = POS_DIM;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
    uVar2 = dynet::ParameterCollection::add_lookup_parameters
                      (uVar6,(Dim *)(ulong)uVar1,(string *)local_b0,(Device *)local_d0);
    *(undefined8 *)local_38 = uVar2;
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
    }
    local_d8[0] = LSTM_INPUT_DIM;
    local_d8[1] = POS_DIM;
    local_94 = 0x100000000;
    lVar3 = 0;
    do {
      uVar4 = local_94 & 0xffffffff;
      local_94 = CONCAT44(local_94._4_4_,(int)local_94 + 1);
      local_b0[uVar4] = *(uint *)((long)local_d8 + lVar3);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 8);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
    uVar2 = dynet::ParameterCollection::add_parameters
                      ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
    *(undefined8 *)local_40 = uVar2;
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
    }
  }
  uVar1 = VOCAB_SIZE;
  if ((local_80->_M_h)._M_element_count == 0) {
    dynet::LookupParameter::LookupParameter
              ((LookupParameter *)local_b0,(LookupParameterStorage *)0x0);
    *(ulong *)this_00 = CONCAT44(local_b0[1],local_b0[0]);
    dynet::Parameter::Parameter((Parameter *)local_b0,(ParameterStorage *)0x0);
    *(ulong *)local_88 = CONCAT44(local_b0[1],local_b0[0]);
  }
  else {
    local_94 = 0x100000001;
    local_b0[0] = PRETRAINED_DIM;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
    uVar2 = dynet::ParameterCollection::add_lookup_parameters
                      (uVar6,(Dim *)(ulong)uVar1,(string *)local_b0,(Device *)local_d0);
    *(undefined8 *)this_00 = uVar2;
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
    }
    p_Var5 = (local_80->_M_h)._M_before_begin._M_nxt;
    if (p_Var5 != (_Hash_node_base *)0x0) {
      do {
        local_b0[0] = *(uint *)&p_Var5[1]._M_nxt;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)local_a8,
                   (vector<float,_std::allocator<float>_> *)(p_Var5 + 2));
        dynet::LookupParameter::initialize((uint)this_00,(vector *)(ulong)local_b0[0]);
        if ((pointer)local_a8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_a8._0_8_);
        }
        p_Var5 = p_Var5->_M_nxt;
      } while (p_Var5 != (_Hash_node_base *)0x0);
    }
    local_d8[0] = LSTM_INPUT_DIM;
    local_d8[1] = PRETRAINED_DIM;
    local_94 = 0x100000000;
    lVar3 = 0;
    do {
      uVar4 = local_94 & 0xffffffff;
      local_94 = CONCAT44(local_94._4_4_,(int)local_94 + 1);
      local_b0[uVar4] = *(uint *)((long)local_d8 + lVar3);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 8);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
    uVar2 = dynet::ParameterCollection::add_parameters
                      ((Dim *)model,0.0,(string *)local_b0,(Device *)local_d0);
    *(undefined8 *)local_88 = uVar2;
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
    }
  }
  return;
}

Assistant:

explicit ParserBuilder(ParameterCollection & model, const unordered_map<unsigned, vector<float>>& pretrained) :
      stack_lstm(LAYERS, LSTM_INPUT_DIM, HIDDEN_DIM, model),
      output_lstm(LAYERS, LSTM_INPUT_DIM, HIDDEN_DIM, model),
      buffer_lstm(LAYERS, LSTM_INPUT_DIM, HIDDEN_DIM, model),
      action_lstm(LAYERS, ACTION_DIM, HIDDEN_DIM, model),
      ent_lstm_fwd(LAYERS, LSTM_INPUT_DIM, LSTM_INPUT_DIM, model), 
      ent_lstm_rev(LAYERS, LSTM_INPUT_DIM, LSTM_INPUT_DIM, model),
      p_w(model.add_lookup_parameters(VOCAB_SIZE, {INPUT_DIM})),
      p_a(model.add_lookup_parameters(ACTION_SIZE, {ACTION_DIM})),
      p_r(model.add_lookup_parameters(ACTION_SIZE, {REL_DIM})),
      p_pbias(model.add_parameters({HIDDEN_DIM})),
      p_A(model.add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_B(model.add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_O(model.add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_S(model.add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_H(model.add_parameters({LSTM_INPUT_DIM, LSTM_INPUT_DIM})),
      p_D(model.add_parameters({LSTM_INPUT_DIM, LSTM_INPUT_DIM})),
      p_R(model.add_parameters({LSTM_INPUT_DIM, REL_DIM})),
      p_w2l(model.add_parameters({LSTM_INPUT_DIM, INPUT_DIM})),
      p_ib(model.add_parameters({LSTM_INPUT_DIM})),
      p_cbias(model.add_parameters({LSTM_INPUT_DIM})),
      p_p2a(model.add_parameters({ACTION_SIZE, HIDDEN_DIM})),
      p_action_start(model.add_parameters({ACTION_DIM})),
      p_abias(model.add_parameters({ACTION_SIZE})),

      p_buffer_guard(model.add_parameters({LSTM_INPUT_DIM})),
      p_stack_guard(model.add_parameters({LSTM_INPUT_DIM})),
      p_output_guard(model.add_parameters({LSTM_INPUT_DIM})),

      p_start_of_word(model.add_parameters({LSTM_INPUT_DIM})), //Miguel
      p_end_of_word(model.add_parameters({LSTM_INPUT_DIM})), //Miguel 

      char_emb(model.add_lookup_parameters(CHAR_SIZE, {INPUT_DIM})),//Miguel

//      fw_char_lstm(LAYERS, LSTM_CHAR_OUTPUT_DIM, LSTM_INPUT_DIM, model), //Miguel
//      bw_char_lstm(LAYERS, LSTM_CHAR_OUTPUT_DIM, LSTM_INPUT_DIM,  model), //Miguel

      fw_char_lstm(LAYERS, LSTM_INPUT_DIM, LSTM_CHAR_OUTPUT_DIM/2, model), //Miguel 
      bw_char_lstm(LAYERS, LSTM_INPUT_DIM, LSTM_CHAR_OUTPUT_DIM/2, model), /*Miguel*/
      p_cW(model.add_parameters({LSTM_INPUT_DIM, LSTM_INPUT_DIM * 2})) { //ner. {
    if (USE_POS) {
      p_p = model.add_lookup_parameters(POS_SIZE, {POS_DIM});
      p_p2l = model.add_parameters({LSTM_INPUT_DIM, POS_DIM});
    }
    if (pretrained.size() > 0) {
      p_t = model.add_lookup_parameters(VOCAB_SIZE, {PRETRAINED_DIM});
      for (auto it : pretrained)
        p_t.initialize(it.first, it.second);
      p_t2l = model.add_parameters({LSTM_INPUT_DIM, PRETRAINED_DIM});
    } else {
      p_t = nullptr;
      p_t2l = nullptr;
    }
  }